

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::to_resource_register_abi_cxx11_
          (CompilerHLSL *this,HLSLBindingFlagBits flag,char space,uint32_t binding,
          uint32_t space_set)

{
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  CompilerHLSL *this_00;
  uint32_t in_R9D;
  allocator local_3d [20];
  allocator local_29;
  uint32_t local_28;
  uint32_t local_24;
  uint32_t space_set_local;
  uint32_t binding_local;
  char space_local;
  CompilerHLSL *pCStack_18;
  HLSLBindingFlagBits flag_local;
  CompilerHLSL *this_local;
  
  this_00 = (CompilerHLSL *)CONCAT44(in_register_00000034,flag);
  space_set_local._3_1_ = (undefined1)binding;
  binding_local = (uint32_t)CONCAT71(in_register_00000011,space);
  local_24 = space_set;
  pCStack_18 = this_00;
  this_local = this;
  if ((binding_local & this_00->resource_binding_flags) == HLSL_BINDING_AUTO_NONE_BIT) {
    local_28 = in_R9D;
    remap_hlsl_resource_binding(this_00,binding_local,&local_28,&local_24);
    if ((binding_local == 1) && (local_28 == 0xffffffff)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",&local_29);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
    }
    else if ((this_00->hlsl_options).shader_model < 0x33) {
      join<char_const(&)[13],char&,unsigned_int&,char_const(&)[2]>
                ((spirv_cross *)this,(char (*) [13])" : register(",
                 (char *)((long)&space_set_local + 3),&local_24,(char (*) [2])0x40bd22);
    }
    else {
      join<char_const(&)[13],char&,unsigned_int&,char_const(&)[8],unsigned_int&,char_const(&)[2]>
                ((spirv_cross *)this,(char (*) [13])" : register(",
                 (char *)((long)&space_set_local + 3),&local_24,(char (*) [8])", space",&local_28,
                 (char (*) [2])0x40bd22);
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"",local_3d);
    ::std::allocator<char>::~allocator((allocator<char> *)local_3d);
  }
  return this;
}

Assistant:

string CompilerHLSL::to_resource_register(HLSLBindingFlagBits flag, char space, uint32_t binding, uint32_t space_set)
{
	if ((flag & resource_binding_flags) == 0)
	{
		remap_hlsl_resource_binding(flag, space_set, binding);

		// The push constant block did not have a binding, and there were no remap for it,
		// so, declare without register binding.
		if (flag == HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT && space_set == ResourceBindingPushConstantDescriptorSet)
			return "";

		if (hlsl_options.shader_model >= 51)
			return join(" : register(", space, binding, ", space", space_set, ")");
		else
			return join(" : register(", space, binding, ")");
	}
	else
		return "";
}